

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

double matd_max(matd_t *m)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  matd_t mVar6;
  matd_t mVar7;
  
  if (m->nrows != 0) {
    uVar1 = m->ncols;
    mVar6.nrows = 0xffffffff;
    mVar6.ncols = 0xffefffff;
    uVar5 = 0;
    uVar4 = 0;
    uVar2 = (ulong)uVar1;
    uVar3 = uVar5;
    do {
      for (; uVar2 != 0; uVar2 = uVar2 - 1) {
        mVar7 = m[(ulong)uVar5 + 1];
        if ((double)m[(ulong)uVar5 + 1] <= (double)mVar6) {
          mVar7 = mVar6;
        }
        uVar5 = uVar5 + 1;
        mVar6 = mVar7;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar3 + uVar1;
      uVar2 = (ulong)uVar1;
      uVar3 = uVar5;
    } while (uVar4 != m->nrows);
    return (double)mVar6;
  }
  return -1.79769313486232e+308;
}

Assistant:

double matd_max(matd_t *m)
{
    double d = -DBL_MAX;
    for(int x=0; x<m->nrows; x++) {
        for(int y=0; y<m->ncols; y++) {
            if(MATD_EL(m, x, y) > d)
                d = MATD_EL(m, x, y);
        }
    }

    return d;
}